

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestSub.c
# Opt level: O0

void sbfRequestSubSubMessageCb(sbfSub sub0,sbfBuffer buffer,void *closure)

{
  void *pvVar1;
  void *data;
  sbfBufferDestroyCb cb;
  sbfBuffer psVar2;
  long in_RDX;
  sbfBuffer in_RSI;
  sbfRequest req;
  sbfBuffer new;
  size_t size;
  sbfRequestHeader *hdr;
  sbfRequestSub sub;
  void *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  
  pvVar1 = sbfBuffer_getData(in_RSI);
  data = (void *)sbfBuffer_getSize(in_RSI);
  if ((void *)0x3f < data) {
    cb = (sbfBufferDestroyCb)sbfMemory_calloc(1,0x68);
    *(long *)(cb + 8) = in_RDX;
    sbfRefCount_init((sbfRefCount *)(cb + 0x30),1);
    sbfGuid_copy(cb + 0x10,pvVar1);
    if (*(long *)(in_RDX + 0x18) != 0) {
      psVar2 = sbfBuffer_wrap(data,in_stack_ffffffffffffffc8,cb,in_stack_ffffffffffffffb8);
      (**(code **)(in_RDX + 0x18))(in_RDX,cb,psVar2,*(undefined8 *)(in_RDX + 0x20));
      sbfBuffer_destroy((sbfBuffer)0x1034cc);
    }
    sbfRequest_destroy((sbfRequest)0x1034d6);
  }
  return;
}

Assistant:

static void
sbfRequestSubSubMessageCb (sbfSub sub0, sbfBuffer buffer, void* closure)
{
    sbfRequestSub     sub = closure;
    sbfRequestHeader* hdr = sbfBuffer_getData (buffer);
    size_t            size = sbfBuffer_getSize (buffer);
    sbfBuffer         new;
    sbfRequest        req;

    if (size < sizeof *hdr)
        return;

    req = xcalloc (1, sizeof *req);
    req->mSub = sub;
    sbfRefCount_init (&req->mRefCount, 1);

    sbfGuid_copy (&req->mGuid, &hdr->mGuid);

    if (sub->mRequestCb != NULL)
    {
        new = sbfBuffer_wrap (hdr + 1, size - sizeof *hdr, NULL, NULL);
        sub->mRequestCb (sub, req, new, sub->mClosure);
        sbfBuffer_destroy (new);
    }

    sbfRequest_destroy (req);
}